

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_indset.cpp
# Opt level: O2

Read<signed_char> __thiscall
Omega_h::find_indset
          (Omega_h *this,Mesh *mesh,Int ent_dim,Reals *quality,Read<signed_char> *candidates)

{
  bool bVar1;
  Int IVar2;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar3;
  Read<signed_char> RVar4;
  Write<signed_char> local_90;
  Write<double> local_80;
  Graph local_70;
  Graph graph;
  
  IVar2 = Mesh::dim(mesh);
  if (IVar2 == ent_dim) {
    Write<signed_char>::Write((Write<signed_char> *)this,&candidates->write_);
    pvVar3 = extraout_RDX;
  }
  else {
    Mesh::owners_have_all_upward(mesh,ent_dim);
    bVar1 = Mesh::owners_have_all_upward(mesh,ent_dim);
    if (!bVar1) {
      fail("assertion %s failed at %s +%d\n","mesh->owners_have_all_upward(ent_dim)",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_indset.cpp"
           ,0x1f);
    }
    Mesh::ask_star(&graph,mesh,ent_dim);
    Graph::Graph(&local_70,&graph);
    Write<double>::Write(&local_80,&quality->write_);
    Write<signed_char>::Write(&local_90,&candidates->write_);
    find_indset(this,mesh,ent_dim,&local_70,(Reals *)&local_80,(Read<signed_char> *)&local_90);
    Write<signed_char>::~Write(&local_90);
    Write<double>::~Write(&local_80);
    Graph::~Graph(&local_70);
    Graph::~Graph(&graph);
    pvVar3 = extraout_RDX_00;
  }
  RVar4.write_.shared_alloc_.direct_ptr = pvVar3;
  RVar4.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar4.write_.shared_alloc_;
}

Assistant:

Read<I8> find_indset(
    Mesh* mesh, Int ent_dim, Reals quality, Read<I8> candidates) {
  if (ent_dim == mesh->dim()) return candidates;
  mesh->owners_have_all_upward(ent_dim);
  OMEGA_H_CHECK(mesh->owners_have_all_upward(ent_dim));
  auto graph = mesh->ask_star(ent_dim);
  return find_indset(mesh, ent_dim, graph, quality, candidates);
}